

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

Am_Value interpolate_1D(Am_Value *value1,Am_Value *value2,float tau)

{
  uint uVar1;
  Am_Wrapper *pAVar2;
  Am_Value *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  float fVar3;
  float fVar4;
  float v1;
  Am_Value AVar5;
  
  fVar3 = Am_Value::operator_cast_to_float(value2);
  fVar4 = Am_Value::operator_cast_to_float(in_RDX);
  if ((tau != -1.0) || (NAN(tau))) {
    fVar3 = fVar3 + (fVar4 - fVar3) * tau;
  }
  else {
    fVar3 = ABS(fVar3 - fVar4);
  }
  uVar1 = value2->type & 0xfffffffe;
  if (((short)uVar1 == 2) && (uVar1 = in_RDX->type & 0xfffffffe, (short)uVar1 == 2)) {
    value1->type = 2;
    pAVar2 = (Am_Wrapper *)(long)(int)fVar3;
    (value1->value).wrapper_value = pAVar2;
  }
  else {
    pAVar2 = (Am_Wrapper *)(ulong)uVar1;
    value1->type = 5;
    (value1->value).float_value = fVar3;
  }
  AVar5.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar5._0_8_ = pAVar2;
  return AVar5;
}

Assistant:

static Am_Value
interpolate_1D(const Am_Value &value1, const Am_Value &value2, float tau)
{
  float return_val;

  if (tau == Am_COMPUTE_DISTANCE) {
    // return magnitude of distance between value1 and value2
    return_val = (float)fabs((float)value1 - (float)value2);
  } else {
    float v1 = value1;
    float v2 = value2;

    // return interpolated value
    return_val = v1 + (v2 - v1) * tau;
  }

  if ((value1.type == Am_INT || value1.type == Am_LONG) &&
      (value2.type == Am_INT || value2.type == Am_LONG))
    return (int)return_val;
  else
    return return_val;
}